

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

void __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>::
~cubeb_resampler_speex
          (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
           *this)

{
  ~cubeb_resampler_speex(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

cubeb_resampler_speex<T, InputProcessor,
                      OutputProcessor>::~cubeb_resampler_speex()
{
}